

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_on_walk_effects.hpp
# Opt level: O1

uint32_t __thiscall
PatchOnWalkEffects::inject_func_handle_item_abilities_on_walk(PatchOnWalkEffects *this,ROM *rom)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  Code func_handle_walk_abilities;
  string local_d8;
  AddressRegister local_b8;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_d8._M_string_length = 0x200ff104e;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::btst(&local_a8,'\x05',(Param *)&local_d8);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"healing_boots","");
  md::Code::beq(&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_b8.super_Register._8_8_ = local_b8.super_Register._8_8_ & 0xffffffffffffff00;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_d8._M_string_length = 0x100000001;
  md::Code::move(&local_a8,(Param *)&local_d8,(Param *)&local_b8,WORD);
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_d8._M_string_length = 0x2000177dc;
  md::Code::jsr(&local_a8,(Param *)&local_d8);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"healing_boots","");
  md::Code::label(&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_b8.super_Register._8_8_ = 0x200ff1150;
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_d8._M_string_length = 7;
  md::Code::cmpi(&local_a8,(ImmediateValue *)&local_d8,(Param *)&local_b8,BYTE);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"return","");
  md::Code::bne(&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_b8.super_Register._8_8_ = local_b8.super_Register._8_8_ & 0xffffffffffffff00;
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_d8._M_string_length = 0x100000100;
  md::Code::move(&local_a8,(Param *)&local_d8,(Param *)&local_b8,WORD);
  local_b8.super_Register._code = '\x05';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_d8._M_string_length = 0x200ff5400;
  md::Code::lea(&local_a8,(Param *)&local_d8,&local_b8);
  local_d8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_d8._M_string_length = 0x20001780e;
  md::Code::jsr(&local_a8,(Param *)&local_d8);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"return","");
  md::Code::label(&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  md::Code::rts(&local_a8);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  uVar2 = md::ROM::inject_code(rom,&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

uint32_t inject_func_handle_item_abilities_on_walk(md::ROM& rom)
    {
        constexpr uint16_t GOLDS_PER_CYCLE = 0x0001;

        md::Code func_handle_walk_abilities;
        {
            func_handle_walk_abilities.btst(0x5, addr_(0xFF104E));
            func_handle_walk_abilities.beq("healing_boots");
            {
                // If Statue of Jypta is owned, gain gold over time
                func_handle_walk_abilities.movew(GOLDS_PER_CYCLE, reg_D0);
                func_handle_walk_abilities.jsr(0x177DC);   // rom.stored_address("func_earn_gold");
            }
            func_handle_walk_abilities.label("healing_boots");
            func_handle_walk_abilities.cmpib(0x7, addr_(0xFF1150));
            func_handle_walk_abilities.bne("return");
            {
                // If Healing boots are equipped, gain life over time
                func_handle_walk_abilities.movew(0x100, reg_D0);
                func_handle_walk_abilities.lea(0xFF5400, reg_A5);
                func_handle_walk_abilities.jsr(0x1780E);   // rom.stored_address("func_heal_hp");
            }
            func_handle_walk_abilities.label("return");
            func_handle_walk_abilities.rts();
        }

        return rom.inject_code(func_handle_walk_abilities);
    }